

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tag_alias_registry.hpp
# Opt level: O0

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  TagAliasRegistry *this_00;
  Colour colourGuard;
  exception *ex;
  SourceLineInfo *lineInfo_local;
  char *tag_local;
  char *alias_local;
  RegistrarForTagAliases *this_local;
  
  this_00 = TagAliasRegistry::get();
  TagAliasRegistry::add(this_00,alias,tag,lineInfo);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {
        try {
            TagAliasRegistry::get().add( alias, tag, lineInfo );
        }
        catch( std::exception& ex ) {
            Colour colourGuard( Colour::Red );
            Catch::cerr() << ex.what() << std::endl;
            exit(1);
        }
    }